

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

result_type __thiscall
math::wide_integer::uniform_int_distribution<2048u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<2048u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  int *piVar1;
  int *piVar2;
  byte bVar3;
  unsigned_fast_type i;
  long lVar4;
  byte bVar5;
  sbyte sVar6;
  void *in_RCX;
  uint uVar8;
  ulong uVar7;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  result_type range;
  uintwide_t<24U,_unsigned_char,_void,_false> result_max;
  uintwide_t<2048U,_unsigned_int,_void,_false> local_420;
  uintwide_t<2048U,_unsigned_int,_void,_false> local_320;
  uint local_220 [64];
  int local_120 [64];
  
  uVar9 = 0;
  memset(this,0,0x100);
  uVar8._0_3_ = input_params->param_a;
  uVar8._3_1_ = (input_params->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
  bVar3 = 1;
  lVar4 = 0;
  do {
    bVar5 = bVar3 - 1 & 3;
    if (bVar5 == 0) {
      uVar10 = (uVar8 % 0xadc8) * 0xbc8f;
      uVar9 = (uVar8 / 0xadc8) * 0xd47;
      uVar8 = (uVar8 / 0xadc8) * -0xd47;
      if (uVar10 < uVar9) {
        uVar8 = uVar9 ^ 0x7fffffff;
      }
      uVar8 = uVar8 + uVar10;
      *(uint *)input_params = uVar8;
      uVar9 = uVar8;
    }
    sVar6 = bVar5 << 3;
    *(uint *)(this + lVar4) = *(uint *)(this + lVar4) | (uVar9 >> sVar6 & 0xff) << sVar6;
    lVar4 = lVar4 + (ulong)((bVar3 & 3) == 0) * 4;
    bVar3 = bVar3 + 1;
  } while (lVar4 != 0x100);
  memcpy(&local_420,in_RCX,0x100);
  memset(&local_320,0,0x100);
  lVar4 = 0xfc;
  do {
    if (lVar4 == -4) {
      memcpy(local_220,(void *)((long)in_RCX + 0x100),0x100);
      memset(local_120,0xff,0x100);
      lVar4 = 0xfc;
      goto LAB_001534c8;
    }
    piVar1 = (int *)((long)local_420.values.super_array<unsigned_int,_64UL>.elems + lVar4);
    piVar2 = (int *)((long)local_320.values.super_array<unsigned_int,_64UL>.elems + lVar4);
    lVar4 = lVar4 + -4;
  } while (*piVar1 == *piVar2);
  goto LAB_001534e9;
  while (piVar1 = (int *)((long)local_220 + lVar4), piVar2 = (int *)((long)local_120 + lVar4),
        lVar4 = lVar4 + -4, *piVar1 == *piVar2) {
LAB_001534c8:
    if (lVar4 == -4) goto LAB_001535e4;
  }
LAB_001534e9:
  memcpy(&local_420,(void *)((long)in_RCX + 0x100),0x100);
  memcpy(local_220,in_RCX,0x100);
  lVar4 = 0;
  bVar11 = false;
  do {
    uVar7 = ((ulong)local_420.values.super_array<unsigned_int,_64UL>.elems[lVar4] - (ulong)bVar11) -
            (ulong)local_220[lVar4];
    local_420.values.super_array<unsigned_int,_64UL>.elems[lVar4] = (value_type_conflict)uVar7;
    bVar11 = uVar7 >> 0x20 != 0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x40);
  memcpy((uniform_int_distribution<2048u,unsigned_int,void,false> *)&local_320,&local_420,0x100);
  lVar4 = 0;
  do {
    piVar1 = (int *)((long)local_320.values.super_array<unsigned_int,_64UL>.elems + lVar4);
    *piVar1 = *piVar1 + 1;
    if (*piVar1 != 0) break;
    bVar11 = lVar4 != 0xfc;
    lVar4 = lVar4 + 4;
  } while (bVar11);
  if ((uniform_int_distribution<2048u,unsigned_int,void,false> *)&local_320 == this) {
    memset(this,0,0x100);
  }
  else {
    memset(&local_420,0,0x100);
    uintwide_t<2048U,_unsigned_int,_void,_false>::eval_divide_knuth
              ((uintwide_t<2048U,_unsigned_int,_void,_false> *)this,&local_320,&local_420);
    memcpy(this,&local_420,0x100);
  }
  memcpy(&local_420,in_RCX,0x100);
  uintwide_t<2048U,_unsigned_int,_void,_false>::operator+=
            ((uintwide_t<2048U,_unsigned_int,_void,_false> *)this,&local_420);
LAB_001535e4:
  return (result_type)SUB83(this,0);
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }